

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O0

PatternList *
parse_expr(Tokens *tokens,vector<docopt::Option,_std::allocator<docopt::Option>_> *options)

{
  initializer_list<std::shared_ptr<docopt::Pattern>_> __l;
  bool bVar1;
  PatternList *in_RDI;
  PatternList ret;
  PatternList seq;
  Tokens *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  Tokens *in_stack_fffffffffffffea8;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *in_stack_fffffffffffffeb0;
  PatternList *in_stack_fffffffffffffeb8;
  allocator_type *in_stack_fffffffffffffec8;
  undefined8 **ppuVar2;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *in_stack_fffffffffffffed0;
  undefined8 **ppuVar3;
  iterator in_stack_fffffffffffffed8;
  undefined1 *puVar4;
  undefined1 local_d9;
  undefined8 *local_d8;
  undefined1 *local_d0 [2];
  undefined8 *local_c0;
  undefined8 local_b8;
  vector<docopt::Option,_std::allocator<docopt::Option>_> *in_stack_ffffffffffffff60;
  Tokens *in_stack_ffffffffffffff68;
  string local_88 [72];
  undefined4 local_40;
  
  parse_seq(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  Tokens::current_abi_cxx11_(in_stack_fffffffffffffe98);
  bVar1 = std::operator!=(in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98);
  if (bVar1) {
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            *)in_stack_fffffffffffffea0,
           (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            *)in_stack_fffffffffffffe98);
    local_40 = 1;
  }
  else {
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            *)0x1b9e7c);
    maybe_collapse_to_required(in_stack_fffffffffffffeb8);
    std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>::
    emplace_back<std::shared_ptr<docopt::Pattern>>
              (in_stack_fffffffffffffeb0,(shared_ptr<docopt::Pattern> *)in_stack_fffffffffffffea8);
    std::shared_ptr<docopt::Pattern>::~shared_ptr((shared_ptr<docopt::Pattern> *)0x1b9eb7);
    while( true ) {
      Tokens::current_abi_cxx11_(in_stack_fffffffffffffe98);
      bVar1 = std::operator==(in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98);
      if (!bVar1) break;
      Tokens::pop_abi_cxx11_(in_stack_fffffffffffffea8);
      std::__cxx11::string::~string(local_88);
      parse_seq(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      operator=(in_stack_fffffffffffffeb0,
                (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                 *)in_stack_fffffffffffffea8);
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector(in_stack_fffffffffffffeb0);
      maybe_collapse_to_required(in_stack_fffffffffffffeb8);
      std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
      ::emplace_back<std::shared_ptr<docopt::Pattern>>
                (in_stack_fffffffffffffeb0,(shared_ptr<docopt::Pattern> *)in_stack_fffffffffffffea8)
      ;
      std::shared_ptr<docopt::Pattern>::~shared_ptr((shared_ptr<docopt::Pattern> *)0x1b9f89);
    }
    local_d8 = local_d0;
    maybe_collapse_to_either(in_stack_fffffffffffffeb8);
    local_c0 = local_d0;
    local_b8 = 1;
    puVar4 = &local_d9;
    std::allocator<std::shared_ptr<docopt::Pattern>_>::allocator
              ((allocator<std::shared_ptr<docopt::Pattern>_> *)0x1ba040);
    __l._M_len = (size_type)puVar4;
    __l._M_array = in_stack_fffffffffffffed8;
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    vector(in_stack_fffffffffffffed0,__l,in_stack_fffffffffffffec8);
    std::allocator<std::shared_ptr<docopt::Pattern>_>::~allocator
              ((allocator<std::shared_ptr<docopt::Pattern>_> *)0x1ba06e);
    ppuVar3 = (undefined8 **)local_d0;
    ppuVar2 = &local_c0;
    do {
      ppuVar2 = ppuVar2 + -2;
      std::shared_ptr<docopt::Pattern>::~shared_ptr((shared_ptr<docopt::Pattern> *)0x1ba097);
    } while (ppuVar2 != ppuVar3);
    local_40 = 1;
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    ~vector(in_stack_fffffffffffffeb0);
  }
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector(in_stack_fffffffffffffeb0);
  return in_RDI;
}

Assistant:

PatternList parse_expr(Tokens& tokens, std::vector<Option>& options)
{
	// expr ::= seq ( '|' seq )* ;

	auto seq = parse_seq(tokens, options);

	if (tokens.current() != "|")
		return seq;

	PatternList ret;
	ret.emplace_back(maybe_collapse_to_required(std::move(seq)));

	while (tokens.current() == "|") {
		tokens.pop();
		seq = parse_seq(tokens, options);
		ret.emplace_back(maybe_collapse_to_required(std::move(seq)));
	}

	return { maybe_collapse_to_either(std::move(ret)) };
}